

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

float * hdr_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *__s1;
  long lVar8;
  float *__ptr;
  undefined4 *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  int in_R8D;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  int z;
  int c2;
  int c1;
  int k;
  int j;
  int i;
  uchar value;
  uchar count;
  int len;
  float *hdr_data;
  stbi_uc *scanline;
  int height;
  int width;
  int valid;
  char *token;
  char buffer [1024];
  undefined1 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb79;
  undefined1 in_stack_fffffffffffffb7a;
  undefined1 in_stack_fffffffffffffb7b;
  undefined4 in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb94;
  int iVar9;
  void *local_458;
  char *local_440 [130];
  int local_2c;
  undefined4 *local_28;
  int *local_20;
  uint *local_18;
  float *local_8;
  
  bVar1 = false;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  __s1 = hdr_gettoken((stbi *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char *)CONCAT44(in_stack_fffffffffffffb7c,
                                       CONCAT13(in_stack_fffffffffffffb7b,
                                                CONCAT12(in_stack_fffffffffffffb7a,
                                                         CONCAT11(in_stack_fffffffffffffb79,
                                                                  in_stack_fffffffffffffb78)))));
  iVar2 = strcmp(__s1,"#?RADIANCE");
  if (iVar2 == 0) {
    while (local_440[0] = hdr_gettoken((stbi *)CONCAT44(in_stack_fffffffffffffb84,
                                                        in_stack_fffffffffffffb80),
                                       (char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                        CONCAT13(in_stack_fffffffffffffb7b,
                                                                 CONCAT12(in_stack_fffffffffffffb7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffb79,
                                                  in_stack_fffffffffffffb78))))),
          *local_440[0] != '\0') {
      iVar2 = strcmp(local_440[0],"FORMAT=32-bit_rle_rgbe");
      if (iVar2 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      local_440[0] = hdr_gettoken((stbi *)CONCAT44(in_stack_fffffffffffffb84,
                                                   in_stack_fffffffffffffb80),
                                  (char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                   CONCAT13(in_stack_fffffffffffffb7b,
                                                            CONCAT12(in_stack_fffffffffffffb7a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb79,
                                                  in_stack_fffffffffffffb78)))));
      iVar2 = strncmp(local_440[0],"-Y ",3);
      if (iVar2 == 0) {
        local_440[0] = local_440[0] + 3;
        lVar8 = strtol(local_440[0],local_440,10);
        iVar2 = (int)lVar8;
        for (; *local_440[0] == ' '; local_440[0] = local_440[0] + 1) {
        }
        iVar3 = strncmp(local_440[0],"+X ",3);
        if (iVar3 == 0) {
          local_440[0] = local_440[0] + 3;
          lVar8 = strtol(local_440[0],(char **)0x0,10);
          uVar4 = (uint)lVar8;
          *local_18 = uVar4;
          *local_20 = iVar2;
          *local_28 = 3;
          if (local_2c == 0) {
            local_2c = 3;
          }
          __ptr = (float *)malloc((long)(int)(iVar2 * uVar4 * local_2c) << 2);
          if (((int)uVar4 < 8) || (0x7fff < (int)uVar4)) {
            iVar3 = 0;
            goto LAB_0010a3bf;
          }
          local_458 = (void *)0x0;
          for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
            in_stack_fffffffffffffb88 =
                 get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                       CONCAT13(in_stack_fffffffffffffb7b,
                                                CONCAT12(in_stack_fffffffffffffb7a,
                                                         CONCAT11(in_stack_fffffffffffffb79,
                                                                  in_stack_fffffffffffffb78)))));
            in_stack_fffffffffffffb84 =
                 get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                       CONCAT13(in_stack_fffffffffffffb7b,
                                                CONCAT12(in_stack_fffffffffffffb7a,
                                                         CONCAT11(in_stack_fffffffffffffb79,
                                                                  in_stack_fffffffffffffb78)))));
            uVar5 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                          CONCAT13(in_stack_fffffffffffffb7b,
                                                   CONCAT12(in_stack_fffffffffffffb7a,
                                                            CONCAT11(in_stack_fffffffffffffb79,
                                                                     in_stack_fffffffffffffb78)))));
            if (((in_stack_fffffffffffffb88 != 2) || (in_stack_fffffffffffffb84 != 2)) ||
               ((uVar5 & 0x80) != 0)) {
              in_stack_fffffffffffffb78 = (undefined1)in_stack_fffffffffffffb88;
              in_stack_fffffffffffffb79 = (undefined1)in_stack_fffffffffffffb84;
              in_stack_fffffffffffffb7a = (undefined1)uVar5;
              iVar9 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                            CONCAT13(in_stack_fffffffffffffb7b,
                                                     CONCAT12(in_stack_fffffffffffffb7a,
                                                              CONCAT11(in_stack_fffffffffffffb79,
                                                                       in_stack_fffffffffffffb78))))
                          );
              in_stack_fffffffffffffb7b = (undefined1)iVar9;
              hdr_convert((float *)CONCAT44(in_stack_fffffffffffffb94,iVar3),
                          (stbi_uc *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                          in_stack_fffffffffffffb84);
              iVar9 = 1;
              iVar3 = 0;
              free(local_458);
              do {
                getn((stbi *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (stbi_uc *)
                     CONCAT44(in_stack_fffffffffffffb7c,
                              CONCAT13(in_stack_fffffffffffffb7b,
                                       CONCAT12(in_stack_fffffffffffffb7a,
                                                CONCAT11(in_stack_fffffffffffffb79,
                                                         in_stack_fffffffffffffb78)))),0);
                hdr_convert((float *)CONCAT44(iVar9,iVar3),
                            (stbi_uc *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                            ,in_stack_fffffffffffffb84);
                iVar9 = iVar9 + 1;
                while ((int)uVar4 <= iVar9) {
                  iVar3 = iVar3 + 1;
LAB_0010a3bf:
                  if (iVar2 <= iVar3) {
                    return __ptr;
                  }
                  iVar9 = 0;
                }
              } while( true );
            }
            uVar6 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                          CONCAT13(in_stack_fffffffffffffb7b,
                                                   CONCAT12(in_stack_fffffffffffffb7a,
                                                            CONCAT11(in_stack_fffffffffffffb79,
                                                                     in_stack_fffffffffffffb78)))));
            if ((uVar6 | uVar5 << 8) != uVar4) {
              free(__ptr);
              free(local_458);
              e("corrupt HDR");
              return (float *)0x0;
            }
            if (local_458 == (void *)0x0) {
              local_458 = malloc((long)(int)(uVar4 << 2));
            }
            for (in_stack_fffffffffffffb8c = 0; in_stack_fffffffffffffb8c < 4;
                in_stack_fffffffffffffb8c = in_stack_fffffffffffffb8c + 1) {
              iVar9 = 0;
              while (iVar9 < (int)uVar4) {
                uVar5 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                              CONCAT13(in_stack_fffffffffffffb7b,
                                                       CONCAT12(in_stack_fffffffffffffb7a,
                                                                CONCAT11(in_stack_fffffffffffffb79,
                                                                         in_stack_fffffffffffffb78))
                                                      )));
                if ((byte)uVar5 < 0x81) {
                  for (in_stack_fffffffffffffb80 = 0;
                      in_stack_fffffffffffffb80 < (int)(uVar5 & 0xff);
                      in_stack_fffffffffffffb80 = in_stack_fffffffffffffb80 + 1) {
                    iVar7 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                                  CONCAT13(in_stack_fffffffffffffb7b,
                                                           CONCAT12(in_stack_fffffffffffffb7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffb79,
                                                  in_stack_fffffffffffffb78)))));
                    *(char *)((long)local_458 + (long)(iVar9 * 4 + in_stack_fffffffffffffb8c)) =
                         (char)iVar7;
                    iVar9 = iVar9 + 1;
                  }
                }
                else {
                  iVar7 = get8((stbi *)CONCAT44(in_stack_fffffffffffffb7c,
                                                CONCAT13(in_stack_fffffffffffffb7b,
                                                         CONCAT12(in_stack_fffffffffffffb7a,
                                                                  CONCAT11(in_stack_fffffffffffffb79
                                                                           ,
                                                  in_stack_fffffffffffffb78)))));
                  for (in_stack_fffffffffffffb80 = 0;
                      in_stack_fffffffffffffb80 < (int)(uint)(byte)((byte)uVar5 + 0x80);
                      in_stack_fffffffffffffb80 = in_stack_fffffffffffffb80 + 1) {
                    *(char *)((long)local_458 + (long)(iVar9 * 4 + in_stack_fffffffffffffb8c)) =
                         (char)iVar7;
                    iVar9 = iVar9 + 1;
                  }
                }
              }
            }
            for (in_stack_fffffffffffffb94 = 0; in_stack_fffffffffffffb94 < (int)uVar4;
                in_stack_fffffffffffffb94 = in_stack_fffffffffffffb94 + 1) {
              hdr_convert((float *)CONCAT44(in_stack_fffffffffffffb94,iVar3),
                          (stbi_uc *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                          in_stack_fffffffffffffb84);
            }
          }
          free(local_458);
          local_8 = __ptr;
        }
        else {
          e("Unsupported HDR format");
          local_8 = (float *)0x0;
        }
      }
      else {
        e("Unsupported HDR format");
        local_8 = (float *)0x0;
      }
    }
    else {
      e("Unsupported HDR format");
      local_8 = (float *)0x0;
    }
  }
  else {
    e("Corrupt HDR image");
    local_8 = (float *)0x0;
  }
  return local_8;
}

Assistant:

static float *hdr_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	float *hdr_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epf("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

   *comp = 3;
	if (req_comp == 0) req_comp = 3;

	// Read data
	hdr_data = (float *) malloc(height * width * req_comp * sizeof(float));

	// Load image data
   // image data is stored as some number of sca
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            getn(s, rgbe, 4);
            hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
	} else {
		// Read RLE-encoded data
		scanline = NULL;

		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4] = { c1,c2,len, get8(s) };
            hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            free(scanline);
            goto main_decode_loop; // yes, this is fucking insane; blame the fucking insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(hdr_data); free(scanline); return epf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) malloc(width * 4);

			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
         for (i=0; i < width; ++i)
            hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
		}
      free(scanline);
	}

   return hdr_data;
}